

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

int xercesc_4_0::XMLUri::scanHexSequence(XMLCh *addr,XMLSize_t index,XMLSize_t end,int *counter)

{
  XMLCh theChar;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = (int)index;
  iVar3 = -1;
  if (index < end) {
    iVar3 = 1 - iVar4;
    iVar5 = 0;
    do {
      theChar = addr[index];
      if (theChar == L':') {
        if ((0 < iVar5) && (iVar1 = *counter, *counter = iVar1 + 1, 7 < iVar1)) {
          return -1;
        }
        if ((iVar5 == 0) || ((iVar5 = 0, index + 1 < end && (addr[index + 1] == L':')))) {
          return (int)index;
        }
      }
      else {
        bVar2 = XMLString::isHex(theChar);
        if (!bVar2) {
          if (2 < iVar5 - 1U) {
            return -1;
          }
          if (theChar != L'.') {
            return -1;
          }
          if (6 < *counter) {
            return -1;
          }
          if (-(iVar5 + iVar3) <= iVar4) {
            return iVar4;
          }
          return -(iVar5 + iVar3);
        }
        if (3 < iVar5) {
          return -1;
        }
        iVar5 = iVar5 + 1;
      }
      index = index + 1;
      iVar3 = iVar3 + -1;
    } while (end != index);
    iVar3 = -1;
    if (0 < iVar5) {
      iVar4 = *counter;
      *counter = iVar4 + 1;
      iVar3 = -1;
      if (iVar4 < 8) {
        iVar3 = (int)end;
      }
    }
  }
  return iVar3;
}

Assistant:

int XMLUri::scanHexSequence (const XMLCh* const addr, XMLSize_t index, XMLSize_t end, int& counter)
{
    XMLCh testChar = chNull;
    int numDigits = 0;
    XMLSize_t start = index;

    // Trying to match the following productions:
    // hexseq = hex4 *( ":" hex4)
    // hex4   = 1*4HEXDIG
    for (; index < end; ++index)
    {
      	testChar = addr[index];
      	if (testChar == chColon)
      	{
      	    // IPv6 addresses are 128-bit, so there can be at most eight sections.
      	    if (numDigits > 0 && ++counter > 8)
      	    {
      	        return -1;
      	    }
      	    // This could be '::'.
      	    if (numDigits == 0 || ((index+1 < end) && addr[index+1] == chColon))
      	    {
      	        return (int)index;
      	    }
      	    numDigits = 0;
        }
        // This might be invalid or an IPv4address. If it's potentially an IPv4address,
        // backup to just after the last valid character that matches hexseq.
        else if (!XMLString::isHex(testChar))
        {
            if (testChar == chPeriod && numDigits < 4 && numDigits > 0 && counter <= 6)
            {
                int back = (int)index - numDigits - 1;
                return (back >= (int)start) ? back : (int)start;
            }
            return -1;
        }
        // There can be at most 4 hex digits per group.
        else if (++numDigits > 4)
        {
            return -1;
        }
    }
    return (numDigits > 0 && ++counter <= 8) ? (int)end : -1;
}